

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlCompareStartClose(void *vkey,void *member)

{
  int iVar1;
  
  iVar1 = strcmp(*vkey,*member);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = strcmp(*(char **)((long)vkey + 8),*(char **)((long)member + 8));
  return iVar1;
}

Assistant:

static int
htmlCompareStartClose(const void *vkey, const void *member) {
    const htmlStartCloseEntry *key = (const htmlStartCloseEntry *) vkey;
    const htmlStartCloseEntry *entry = (const htmlStartCloseEntry *) member;
    int ret;

    ret = strcmp(key->oldTag, entry->oldTag);
    if (ret == 0)
        ret = strcmp(key->newTag, entry->newTag);

    return(ret);
}